

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void fix_bind(xr_bone *bone)

{
  pointer ppxVar1;
  xr_bone *pxVar2;
  pointer ppxVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  fmatrix local_i;
  fmatrix total_i;
  fmatrix parent_i;
  fmatrix local;
  fmatrix parent;
  fmatrix total;
  _matrix<float> local_1b0;
  _matrix<float> local_170;
  _matrix<float> local_130;
  _matrix<float> local_f0;
  anon_union_64_4_b9f67276_for__matrix<float>_1 local_b0;
  anon_union_64_4_b9f67276_for__matrix<float>_1 local_70;
  
  ppxVar1 = (bone->m_children).
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppxVar3 = (bone->m_children).
                 super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppxVar3 != ppxVar1; ppxVar3 = ppxVar3 + 1) {
    fix_bind(*ppxVar3);
  }
  if (bone->m_parent != (xr_bone *)0x0) {
    fVar4 = -(bone->m_bind_rotate).field_0.field_0.y;
    fVar9 = -(bone->m_bind_rotate).field_0.field_0.x;
    fVar8 = -(bone->m_bind_rotate).field_0.field_0.z;
    fVar5 = sinf(fVar4);
    fVar4 = cosf(fVar4);
    fVar6 = sinf(fVar9);
    fVar9 = cosf(fVar9);
    fVar7 = sinf(fVar8);
    fVar8 = cosf(fVar8);
    local_70.field_0._11 = fVar4 * fVar8 - fVar7 * fVar5 * fVar6;
    local_70.field_0._12 = fVar7 * -fVar9;
    local_70.field_0._21 = fVar5 * fVar6 * fVar8 + fVar4 * fVar7;
    local_70.field_0._13 = fVar4 * fVar7 * fVar6 + fVar5 * fVar8;
    local_70.field_0._14 = 0.0;
    local_70.field_0._22 = fVar9 * fVar8;
    local_70.field_0._23 = fVar7 * fVar5 - fVar4 * fVar6 * fVar8;
    local_70.field_0._24 = 0.0;
    local_70.field_0._31 = -fVar9 * fVar5;
    local_70.field_0._33 = fVar4 * fVar9;
    local_70.field_0._44 = 1.0;
    local_70._44_8_ = (ulong)(uint)(bone->m_bind_offset).field_0.field_0.x << 0x20;
    local_70._52_8_ = *(undefined8 *)((long)&(bone->m_bind_offset).field_0 + 4);
    pxVar2 = bone->m_parent;
    fVar4 = -(pxVar2->m_bind_rotate).field_0.field_0.y;
    fVar9 = -(pxVar2->m_bind_rotate).field_0.field_0.x;
    fVar8 = -(pxVar2->m_bind_rotate).field_0.field_0.z;
    local_70.field_0._32 = fVar6;
    fVar5 = sinf(fVar4);
    fVar4 = cosf(fVar4);
    fVar6 = sinf(fVar9);
    fVar9 = cosf(fVar9);
    fVar7 = sinf(fVar8);
    fVar8 = cosf(fVar8);
    local_b0.field_0._11 = fVar4 * fVar8 - fVar7 * fVar5 * fVar6;
    local_b0.field_0._12 = fVar7 * -fVar9;
    local_b0.field_0._21 = fVar5 * fVar6 * fVar8 + fVar4 * fVar7;
    local_b0.field_0._13 = fVar4 * fVar7 * fVar6 + fVar5 * fVar8;
    local_b0.field_0._14 = 0.0;
    local_b0.field_0._22 = fVar9 * fVar8;
    local_b0.field_0._23 = fVar7 * fVar5 - fVar4 * fVar6 * fVar8;
    local_b0.field_0._24 = 0.0;
    local_b0.field_0._31 = -fVar9 * fVar5;
    local_b0.field_0._33 = fVar4 * fVar9;
    local_b0.field_0._44 = 1.0;
    local_b0._44_8_ = (ulong)(uint)(bone->m_parent->m_bind_offset).field_0.field_0.x << 0x20;
    local_b0._52_8_ = *(undefined8 *)((long)&(bone->m_parent->m_bind_offset).field_0 + 4);
    local_b0.field_0._32 = fVar6;
    xray_re::_matrix<float>::invert_43(&local_130,(_matrix<float> *)&local_b0.field_0);
    xray_re::_matrix<float>::invert_43(&local_170,(_matrix<float> *)&local_70.field_0);
    xray_re::_matrix<float>::mul_43(&local_f0,&local_170,(_matrix<float> *)&local_b0.field_0);
    xray_re::_matrix<float>::invert_43(&local_1b0,&local_f0);
    *(undefined8 *)&(bone->m_bind_offset).field_0 = local_1b0.field_0._48_8_;
    (bone->m_bind_offset).field_0.field_0.z = local_1b0.field_0.field_0._43;
    xray_re::_matrix<float>::get_hpb
              (&local_1b0,&(bone->m_bind_rotate).field_0.field_0.y,(float *)&bone->m_bind_rotate,
               &(bone->m_bind_rotate).field_0.field_0.z);
    fVar4 = (bone->m_bind_rotate).field_0.field_0.y;
    fVar5 = (bone->m_bind_rotate).field_0.field_0.z;
    (bone->m_bind_rotate).field_0.field_0.x = -(bone->m_bind_rotate).field_0.field_0.x;
    (bone->m_bind_rotate).field_0.field_0.y = -fVar4;
    (bone->m_bind_rotate).field_0.field_0.z = -fVar5;
  }
  return;
}

Assistant:

void fix_bind(xr_bone * bone)
{
	for (xr_bone_vec_it it = bone->children().begin(), end = bone->children().end(); it != end; ++it)
		fix_bind(*it);

	if (!bone->is_root())
	{
		fmatrix total, parent, local, parent_i, total_i, local_i;
		total.set_xyz_i(bone->bind_rotate());
		total.c.set(bone->bind_offset());
		parent.set_xyz_i(bone->parent()->bind_rotate());
		parent.c.set(bone->parent()->bind_offset());
		parent_i.invert_43(parent);
		total_i.invert_43(total);
		local.mul_43(total_i, parent);
		local_i.invert_43(local);

		bone->bind_offset() = local_i.c;
		local_i.get_xyz_i(bone->bind_rotate());
	}
}